

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O0

int loop_restoration_row_worker(void *arg1,void *arg2)

{
  long lVar1;
  int iVar2;
  int vnum_rest_units;
  RestorationLineBuffers *rlbs;
  code *on_rest_unit;
  YV12_BUFFER_CONFIG *in_RSI;
  RestorationTileLimits *in_RDI;
  sync_write_fn_t on_sync_write;
  sync_read_fn_t on_sync_read;
  RestorationTileLimits limits;
  AV1LrMTInfo *cur_job_info;
  aom_internal_error_info *error_info;
  pthread_mutex_t *job_mutex_;
  int plane_w;
  int plane;
  int lr_unit_row;
  FilterFrameCtxt *ctxt;
  AV1LrStruct *lr_ctxt;
  LRWorkerData *lrworkerdata;
  AV1LrSync *lr_sync;
  int in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  FilterFrameCtxt *in_stack_ffffffffffffff28;
  AV1LrSync *in_stack_ffffffffffffff30;
  void *in_stack_ffffffffffffff60;
  anon_union_8_2_d0c63512_for_yv12_buffer_config_8 *on_sync_read_00;
  pthread_mutex_t *__mutex;
  undefined4 in_stack_ffffffffffffff88;
  int iVar3;
  YV12_BUFFER_CONFIG *ybf;
  int local_34;
  
  lVar1 = *(long *)(in_RSI->field_2).crop_widths;
  __mutex = *(pthread_mutex_t **)&in_RDI[5].v_start;
  on_sync_read_00 = &in_RSI->field_4;
  ybf = in_RSI;
  iVar2 = _setjmp((__jmp_buf_tag *)&in_RSI[1].field_5.field_0);
  if (iVar2 == 0) {
    on_sync_read_00[0x1a].field_0.y_stride = 1;
    while (rlbs = (RestorationLineBuffers *)
                  get_lr_job_info((AV1LrSync *)
                                  CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)),
          rlbs != (RestorationLineBuffers *)0x0) {
      in_stack_ffffffffffffff10 = *(int *)(rlbs->tmp_save_above[0] + 6);
      iVar2 = *(int *)(lVar1 + (long)in_stack_ffffffffffffff10 * 0x38 + 0x18);
      on_rest_unit = av1_lr_sync_read_dummy;
      if (*(int *)(rlbs->tmp_save_above[0] + 8) == 1) {
        on_rest_unit = lr_sync_read;
      }
      vnum_rest_units = 0x6ee1c0;
      if (*(int *)(rlbs->tmp_save_above[0] + 8) == 0) {
        vnum_rest_units = 0x6f4d00;
      }
      iVar3 = in_stack_ffffffffffffff10;
      av1_foreach_rest_unit_in_row
                (in_RDI,0,on_rest_unit,(in_RSI->field_1).field_0.uv_height,
                 (in_RSI->field_1).field_0.y_height,(in_RSI->field_0).field_0.uv_width,
                 vnum_rest_units,(int)on_rest_unit,in_stack_ffffffffffffff60,
                 *(int32_t **)rlbs->tmp_save_above[0],rlbs,(sync_read_fn_t)on_sync_read_00,
                 (sync_write_fn_t)__mutex->__size,
                 (AV1LrSyncData *)CONCAT44(iVar2,in_stack_ffffffffffffff88),
                 (aom_internal_error_info *)
                 CONCAT44(*(undefined4 *)(rlbs->tmp_save_above[0] + 4),in_stack_ffffffffffffff10));
      (*loop_restoration_row_worker::copy_funs[iVar3])
                (*(YV12_BUFFER_CONFIG **)(lVar1 + 0xb8),*(YV12_BUFFER_CONFIG **)(lVar1 + 0xb0),0,
                 iVar2,*(int *)(rlbs->tmp_save_above[0] + 10),
                 *(int *)(rlbs->tmp_save_above[0] + 0xc));
      if ((in_RSI->field_3).field_0.y_crop_height != 0) {
        aom_extend_frame_borders_plane_row_c
                  (ybf,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,(int)((ulong)in_RSI >> 0x20));
      }
    }
    on_sync_read_00[0x1a].field_0.y_stride = 0;
    local_34 = 1;
  }
  else {
    on_sync_read_00[0x1a].field_0.y_stride = 0;
    pthread_mutex_lock(__mutex);
    *(undefined1 *)&in_RDI[7].v_start = 1;
    pthread_mutex_unlock(__mutex);
    set_loop_restoration_done(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    local_34 = 0;
  }
  return local_34;
}

Assistant:

static int loop_restoration_row_worker(void *arg1, void *arg2) {
  AV1LrSync *const lr_sync = (AV1LrSync *)arg1;
  LRWorkerData *lrworkerdata = (LRWorkerData *)arg2;
  AV1LrStruct *lr_ctxt = (AV1LrStruct *)lrworkerdata->lr_ctxt;
  FilterFrameCtxt *ctxt = lr_ctxt->ctxt;
  int lr_unit_row;
  int plane;
  int plane_w;
#if CONFIG_MULTITHREAD
  pthread_mutex_t *job_mutex_ = lr_sync->job_mutex;
#endif
  struct aom_internal_error_info *const error_info = &lrworkerdata->error_info;

  // The jmp_buf is valid only for the duration of the function that calls
  // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
  // before it returns.
  if (setjmp(error_info->jmp)) {
    error_info->setjmp = 0;
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(job_mutex_);
    lr_sync->lr_mt_exit = true;
    pthread_mutex_unlock(job_mutex_);
#endif
    // In case of loop restoration multithreading, the worker on an even lr
    // block row waits for the completion of the filtering of the top-right and
    // bottom-right blocks. Hence, in case a thread (main/worker) encounters an
    // error, update that filtering of every row in the frame is complete in
    // order to avoid the dependent workers from waiting indefinitely.
    set_loop_restoration_done(lr_sync, lr_ctxt->ctxt);
    return 0;
  }
  error_info->setjmp = 1;

  typedef void (*copy_fun)(const YV12_BUFFER_CONFIG *src_ybc,
                           YV12_BUFFER_CONFIG *dst_ybc, int hstart, int hend,
                           int vstart, int vend);
  static const copy_fun copy_funs[MAX_MB_PLANE] = {
    aom_yv12_partial_coloc_copy_y, aom_yv12_partial_coloc_copy_u,
    aom_yv12_partial_coloc_copy_v
  };

  while (1) {
    AV1LrMTInfo *cur_job_info = get_lr_job_info(lr_sync);
    if (cur_job_info != NULL) {
      RestorationTileLimits limits;
      sync_read_fn_t on_sync_read;
      sync_write_fn_t on_sync_write;
      limits.v_start = cur_job_info->v_start;
      limits.v_end = cur_job_info->v_end;
      lr_unit_row = cur_job_info->lr_unit_row;
      plane = cur_job_info->plane;
      plane_w = ctxt[plane].plane_w;

      // sync_mode == 1 implies only sync read is required in LR Multi-threading
      // sync_mode == 0 implies only sync write is required.
      on_sync_read =
          cur_job_info->sync_mode == 1 ? lr_sync_read : av1_lr_sync_read_dummy;
      on_sync_write = cur_job_info->sync_mode == 0 ? lr_sync_write
                                                   : av1_lr_sync_write_dummy;

      av1_foreach_rest_unit_in_row(
          &limits, plane_w, lr_ctxt->on_rest_unit, lr_unit_row,
          ctxt[plane].rsi->restoration_unit_size, ctxt[plane].rsi->horz_units,
          ctxt[plane].rsi->vert_units, plane, &ctxt[plane],
          lrworkerdata->rst_tmpbuf, lrworkerdata->rlbs, on_sync_read,
          on_sync_write, lr_sync, error_info);

      copy_funs[plane](lr_ctxt->dst, lr_ctxt->frame, 0, plane_w,
                       cur_job_info->v_copy_start, cur_job_info->v_copy_end);

      if (lrworkerdata->do_extend_border) {
        aom_extend_frame_borders_plane_row(lr_ctxt->frame, plane,
                                           cur_job_info->v_copy_start,
                                           cur_job_info->v_copy_end);
      }
    } else {
      break;
    }
  }
  error_info->setjmp = 0;
  return 1;
}